

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize.hpp
# Opt level: O1

Image4u * eos::core::image::resize
                    (Image4u *__return_storage_ptr__,Image4u *image,int width,int height)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uchar uVar4;
  int y;
  int iVar5;
  Pixel<unsigned_char,_4> *pPVar6;
  int iVar7;
  int iVar8;
  int x;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  int iVar16;
  int iVar18;
  int iVar19;
  int iVar20;
  undefined1 auVar17 [16];
  int source_x;
  int local_b4;
  
  iVar5 = image->width_;
  iVar8 = image->height_;
  Image<eos::core::Pixel<unsigned_char,_4>_>::Image(__return_storage_ptr__,height,width);
  if (0 < width) {
    fVar9 = (float)width / (float)iVar5;
    fVar10 = (float)height / (float)iVar8;
    local_b4 = 0;
    do {
      if (0 < height) {
        fVar11 = (float)local_b4 / fVar9;
        fVar12 = ceilf(fVar11);
        fVar13 = floorf(((float)local_b4 + 1.0) / fVar9);
        fVar11 = roundf(fVar11);
        iVar5 = (int)fVar11;
        iVar8 = 0;
        do {
          fVar11 = (float)iVar8 / fVar10;
          iVar16 = 0;
          iVar18 = 0;
          iVar19 = 0;
          iVar20 = 0;
          iVar7 = 0;
          if ((float)(int)fVar12 <= fVar13) {
            fVar14 = ceilf(fVar11);
            fVar15 = floorf(((float)iVar8 + 1.0) / fVar10);
            iVar16 = 0;
            iVar18 = 0;
            iVar19 = 0;
            iVar20 = 0;
            iVar7 = 0;
            y = (int)fVar14;
            x = (int)fVar12;
            do {
              for (; (float)y <= fVar15; y = y + 1) {
                if ((x < image->width_) && (y < image->height_)) {
                  iVar7 = iVar7 + 1;
                  pPVar6 = Image<eos::core::Pixel<unsigned_char,_4>_>::operator()(image,y,x);
                  bVar1 = (pPVar6->data_)._M_elems[0];
                  pPVar6 = Image<eos::core::Pixel<unsigned_char,_4>_>::operator()(image,y,x);
                  bVar2 = (pPVar6->data_)._M_elems[1];
                  pPVar6 = Image<eos::core::Pixel<unsigned_char,_4>_>::operator()(image,y,x);
                  bVar3 = (pPVar6->data_)._M_elems[2];
                  pPVar6 = Image<eos::core::Pixel<unsigned_char,_4>_>::operator()(image,y,x);
                  iVar16 = iVar16 + (uint)bVar1;
                  iVar18 = iVar18 + (uint)bVar2;
                  iVar19 = iVar19 + (uint)bVar3;
                  iVar20 = iVar20 + (uint)(pPVar6->data_)._M_elems[3];
                }
              }
              x = x + 1;
              y = (int)fVar14;
            } while ((float)x <= fVar13);
          }
          if (iVar7 < 1) {
            fVar11 = roundf(fVar11);
            iVar7 = (int)fVar11;
            if (iVar7 < image->height_) {
              auVar17._4_4_ = iVar18;
              auVar17._0_4_ = iVar16;
              auVar17._8_4_ = iVar19;
              auVar17._12_4_ = iVar20;
              if (iVar5 < image->width_) {
                pPVar6 = Image<eos::core::Pixel<unsigned_char,_4>_>::operator()(image,iVar7,iVar5);
                bVar1 = (pPVar6->data_)._M_elems[0];
                pPVar6 = Image<eos::core::Pixel<unsigned_char,_4>_>::operator()(image,iVar7,iVar5);
                uVar4 = (pPVar6->data_)._M_elems[1];
                pPVar6 = Image<eos::core::Pixel<unsigned_char,_4>_>::operator()(image,iVar7,iVar5);
                bVar2 = (pPVar6->data_)._M_elems[2];
                pPVar6 = Image<eos::core::Pixel<unsigned_char,_4>_>::operator()(image,iVar7,iVar5);
                auVar17._1_3_ = 0;
                auVar17[0] = bVar1;
                auVar17[4] = uVar4;
                auVar17._5_3_ = 0;
                auVar17._9_3_ = 0;
                auVar17[8] = bVar2;
                auVar17[0xc] = (pPVar6->data_)._M_elems[3];
                auVar17._13_3_ = 0;
              }
            }
            else {
              auVar17._4_4_ = iVar18;
              auVar17._0_4_ = iVar16;
              auVar17._8_4_ = iVar19;
              auVar17._12_4_ = iVar20;
            }
          }
          else {
            auVar17._12_4_ = iVar20 / iVar7;
            auVar17._8_4_ = iVar19 / iVar7;
            auVar17._4_4_ = iVar18 / iVar7;
            auVar17._0_4_ = iVar16 / iVar7;
          }
          pPVar6 = Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                             (__return_storage_ptr__,iVar8,local_b4);
          *(uint *)(pPVar6->data_)._M_elems =
               auVar17._0_4_ & 0xff |
               (auVar17._4_4_ & 0xff) << 8 | (auVar17._8_4_ & 0xff) << 0x10 | auVar17._12_4_ << 0x18
          ;
          iVar8 = iVar8 + 1;
        } while (iVar8 != height);
      }
      local_b4 = local_b4 + 1;
    } while (local_b4 != width);
  }
  return __return_storage_ptr__;
}

Assistant:

inline eos::core::Image4u resize(const eos::core::Image4u& image, int width, int height)
{
    using Eigen::Vector4i;
    using std::ceil;
    using std::floor;
    using std::round;
    using std::uint8_t;

    const float scaling_width = static_cast<float>(width) / image.width();
    const float scaling_height = static_cast<float>(height) / image.height();

    eos::core::Image4u resized_image(height, width);
    for (int w = 0; w < width; ++w)
    {
        for (int h = 0; h < height; ++h)
        {
            const float left = (static_cast<float>(w)) / scaling_width;
            const float right = (static_cast<float>(w) + 1.0f) / scaling_width;
            const float bottom = (static_cast<float>(h)) / scaling_height;
            const float top = (static_cast<float>(h) + 1.0f) / scaling_height;

            Vector4i color = Vector4i::Zero(); // std::uint8_t actually.
            int num_texels = 0;
            // loop over square in which quadrangle out of the four corners of pixel is
            for (int a = ceil(left); a <= floor(right); ++a)
            {
                for (int b = ceil(bottom); b <= floor(top); ++b)
                {
                    // check if texel is in image
                    if (a < image.width() && b < image.height())
                    {
                        num_texels++;
                        color += Vector4i(image(b, a)[0], image(b, a)[1], image(b, a)[2], image(b, a)[3]);
                    }
                }
            }
            if (num_texels > 0)
                color = color / num_texels;
            else
            { // if no corresponding texel found, nearest neighbour interpolation
              // calculate corresponding position of dst_coord pixel center in image (src)
                const int source_x = round(static_cast<float>(w) / scaling_width);
                const int source_y = round(static_cast<float>(h) / scaling_height);

                if (source_y < image.height() && source_x < image.width())
                {
                    color = Vector4i(image(source_y, source_x)[0], image(source_y, source_x)[1],
                                     image(source_y, source_x)[2], image(source_y, source_x)[3]);
                }
            }

            resized_image(h, w) = {
                static_cast<std::uint8_t>(round(color[0])), static_cast<std::uint8_t>(round(color[1])),
                static_cast<std::uint8_t>(round(color[2])), static_cast<std::uint8_t>(round(color[3]))};
        }
    }

    return resized_image;
}